

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressions.hpp
# Opt level: O3

void __thiscall FunctionReturned::FunctionReturned(FunctionReturned *this,Item *i)

{
  pointer pcVar1;
  
  (this->item).token.type = (i->token).type;
  (this->item).token.source._M_dataplus._M_p = (pointer)&(this->item).token.source.field_2;
  pcVar1 = (i->token).source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->item).token.source,pcVar1,pcVar1 + (i->token).source._M_string_length
            );
  (this->item).source._M_dataplus._M_p = (pointer)&(this->item).source.field_2;
  pcVar1 = (i->source)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->item).source,pcVar1,pcVar1 + (i->source)._M_string_length);
  (this->item).value = i->value;
  (this->item).type._M_dataplus._M_p = (pointer)&(this->item).type.field_2;
  pcVar1 = (i->type)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->item).type,pcVar1,pcVar1 + (i->type)._M_string_length);
  (this->exception).type = Nothing;
  (this->exception).line = -1;
  this->isVoid = false;
  return;
}

Assistant:

FunctionReturned(Item i) : item(i), exception(Nothing), isVoid(false) {}